

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

void t1_dec_clnpass(opj_t1_t *t1,int bpno,int orient,int cblksty)

{
  byte *pbVar1;
  char cVar2;
  opj_mqc_t *mqc;
  opj_mqc_t *poVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ushort uVar13;
  uint oneplushalf;
  int iVar14;
  int iVar15;
  long lVar16;
  ushort *puVar17;
  int *piVar18;
  long lVar19;
  uint *datap;
  flag_t *pfVar20;
  int iVar21;
  uint uVar22;
  int *piVar23;
  bool bVar24;
  flag_t *local_90;
  uint local_68;
  uint local_58;
  uint local_40;
  
  mqc = t1->mqc;
  oneplushalf = (1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
  if ((cblksty & 8U) == 0) {
    piVar23 = t1->data;
    local_90 = t1->flags + 1;
    if ((int)(t1->h & 0xfffffffcU) < 1) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      do {
        iVar4 = t1->w;
        if (0 < iVar4) {
          local_68 = uVar11 | 1;
          lVar16 = 0;
          do {
            piVar18 = piVar23 + lVar16;
            pfVar20 = t1->flags;
            iVar4 = t1->flags_stride;
            lVar19 = lVar16 + 1;
            iVar14 = (int)lVar19;
            if ((((pfVar20[(int)(iVar4 * local_68 + iVar14)] & 0x50ffU) == 0) &&
                ((pfVar20[(int)(iVar4 * (uVar11 | 2) + iVar14)] & 0x50ffU) == 0)) &&
               (((pfVar20[(int)(iVar4 * (uVar11 | 3) + iVar14)] & 0x50ffU) == 0 &&
                ((pfVar20[(int)(iVar4 * (uVar11 + 4) + iVar14)] & 0x50ffU) == 0)))) {
              mqc->curctx = mqc->ctxs + 0x11;
              iVar4 = mqc_decode(mqc);
              if (iVar4 != 0) {
                mqc->curctx = mqc->ctxs + 0x12;
                iVar4 = mqc_decode(mqc);
                uVar22 = mqc_decode(mqc);
                uVar22 = uVar22 | iVar4 * 2;
                if ((int)uVar22 < 4) {
                  datap = (uint *)(piVar18 + (long)t1->w * (long)(int)uVar22);
                  puVar17 = (ushort *)
                            (local_90 + lVar16 + (long)t1->flags_stride * (long)(int)uVar22);
                  iVar4 = 0;
                  do {
                    if (t1->h <= (int)(uVar22 + uVar11 + iVar4)) break;
                    puVar17 = puVar17 + t1->flags_stride;
                    if (iVar4 == 0) {
                      poVar3 = t1->mqc;
                      uVar10 = *puVar17 >> 4 & 0xff;
                      poVar3->curctx =
                           poVar3->ctxs +
                           "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                           [uVar10];
                      uVar5 = mqc_decode(poVar3);
                      cVar2 = ""[uVar10];
                      uVar10 = -oneplushalf;
                      if (uVar5 == (int)cVar2) {
                        uVar10 = oneplushalf;
                      }
                      *datap = uVar10;
                      t1_updateflags((flag_t *)puVar17,uVar5 ^ (int)cVar2,t1->flags_stride);
                      *(byte *)((long)puVar17 + 1) = *(byte *)((long)puVar17 + 1) & 0xbf;
                    }
                    else {
                      t1_dec_clnpass_step(t1,(flag_t *)puVar17,(int *)datap,orient,oneplushalf);
                    }
                    datap = datap + t1->w;
                    iVar14 = uVar22 + uVar11 + iVar4;
                    iVar4 = iVar4 + 1;
                  } while (iVar14 + 1 < (int)(uVar11 + 4));
                }
              }
            }
            else {
              pfVar20 = local_90 + lVar16 + iVar4;
              t1_dec_clnpass_step(t1,pfVar20,piVar18,orient,oneplushalf);
              piVar18 = piVar18 + t1->w;
              pfVar20 = pfVar20 + t1->flags_stride;
              t1_dec_clnpass_step(t1,pfVar20,piVar18,orient,oneplushalf);
              iVar4 = t1->w;
              iVar14 = t1->flags_stride;
              t1_dec_clnpass_step(t1,pfVar20 + iVar14,piVar18 + iVar4,orient,oneplushalf);
              t1_dec_clnpass_step(t1,pfVar20 + iVar14 + t1->flags_stride,piVar18 + iVar4 + t1->w,
                                  orient,oneplushalf);
            }
            iVar4 = t1->w;
            lVar16 = lVar19;
          } while (lVar19 < iVar4);
        }
        piVar23 = piVar23 + (iVar4 << 2);
        local_90 = local_90 + (t1->flags_stride << 2);
        uVar11 = uVar11 + 4;
      } while ((int)uVar11 < (int)(t1->h & 0xfffffffcU));
    }
    if (0 < t1->w) {
      lVar16 = 0;
      do {
        if ((int)uVar11 < t1->h) {
          pfVar20 = local_90 + lVar16;
          piVar18 = piVar23 + lVar16;
          uVar22 = uVar11;
          do {
            pfVar20 = pfVar20 + t1->flags_stride;
            t1_dec_clnpass_step(t1,pfVar20,piVar18,orient,oneplushalf);
            piVar18 = piVar18 + t1->w;
            uVar22 = uVar22 + 1;
          } while ((int)uVar22 < t1->h);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < t1->w);
    }
  }
  else if (0 < t1->h) {
    uVar11 = 0;
    iVar4 = -1;
    do {
      if (0 < t1->w) {
        uVar22 = uVar11 | 3;
        local_40 = uVar11 | 1;
        local_58 = uVar11 | 2;
        iVar14 = 0;
        do {
          bVar24 = true;
          if ((int)uVar22 < t1->h) {
            pfVar20 = t1->flags;
            iVar6 = t1->flags_stride;
            if ((((pfVar20[(int)(iVar6 * local_40 + iVar14 + 1)] & 0x50ffU) == 0) &&
                (iVar15 = iVar14 + 1, (pfVar20[(int)(iVar6 * local_58 + iVar15)] & 0x50ffU) == 0))
               && ((pfVar20[(int)(iVar6 * uVar22 + iVar15)] & 0x50ffU) == 0)) {
              bVar24 = (pfVar20[(int)(iVar6 * (uVar11 + 4) + iVar15)] & 0x50b9U) != 0;
            }
          }
          uVar10 = 0;
          if (bVar24) {
LAB_002092ea:
            if ((int)uVar10 < 4) {
              iVar15 = 0;
              iVar6 = iVar4 + uVar10;
              do {
                iVar21 = iVar6 + 1;
                if (t1->h <= iVar21) break;
                pfVar20 = t1->flags;
                iVar12 = (iVar6 + 2) * t1->flags_stride + iVar14;
                iVar6 = t1->w;
                puVar17 = (ushort *)(pfVar20 + (long)iVar12 + 1);
                uVar9 = *puVar17;
                uVar13 = uVar9 & 0xfbb9;
                if (iVar21 == t1->h + -1) {
                  uVar9 = uVar13;
                }
                poVar3 = t1->mqc;
                piVar23 = t1->data;
                if (3 - uVar10 == iVar15) {
                  uVar9 = uVar13;
                }
                if ((bool)(iVar15 != 0 | bVar24)) {
                  if ((uVar9 & 0x5000) == 0) {
                    poVar3->curctx = poVar3->ctxs + ""[(int)(uVar9 & 0xff | orient << 8)];
                    iVar7 = mqc_decode(poVar3);
                    if (iVar7 != 0) goto LAB_002093cb;
                  }
                }
                else {
LAB_002093cb:
                  uVar5 = uVar9 >> 4 & 0xff;
                  poVar3->curctx =
                       poVar3->ctxs +
                       "\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\r\n\n\r\r\f\v\t\n\v\v\n\n\t\n\f\v\n\t\r\f\f\r\t\n\v\f\n\t\t\n\f\v\n\n\v\v\f\v\f\v\v\v\v\v\t\n\f\r\n\t\v\f\f\r\f\r\v\f\v\f\t\n\f\r\n\t\v\f\f\v\t\n\r\f\n\t\t\n\f\v\n\n\v\v\f\r\t\n\r\r\n\n\t\n\f\v\n\t\r\f\f\v\f\v\r\f\r\f\t\n\f\r\n\n\r\r\f\r\f\r\r\r\r\r"
                       [uVar5];
                  uVar8 = mqc_decode(poVar3);
                  cVar2 = ""[uVar5];
                  uVar5 = -oneplushalf;
                  if (uVar8 == (int)cVar2) {
                    uVar5 = oneplushalf;
                  }
                  piVar23[iVar6 * iVar21 + iVar14] = uVar5;
                  t1_updateflags((flag_t *)puVar17,uVar8 ^ (int)cVar2,t1->flags_stride);
                }
                pbVar1 = (byte *)((long)pfVar20 + (long)iVar12 * 2 + 3);
                *pbVar1 = *pbVar1 & 0xbf;
                iVar15 = iVar15 + 1;
                iVar6 = iVar21;
              } while (iVar21 < (int)uVar22);
            }
          }
          else {
            mqc->curctx = mqc->ctxs + 0x11;
            iVar6 = mqc_decode(mqc);
            if (iVar6 != 0) {
              mqc->curctx = mqc->ctxs + 0x12;
              iVar6 = mqc_decode(mqc);
              uVar10 = mqc_decode(mqc);
              uVar10 = uVar10 | iVar6 * 2;
              goto LAB_002092ea;
            }
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < t1->w);
      }
      uVar11 = uVar11 + 4;
      iVar4 = iVar4 + 4;
    } while ((int)uVar11 < t1->h);
  }
  if ((cblksty & 0x20U) != 0) {
    mqc->curctx = mqc->ctxs + 0x12;
    mqc_decode(mqc);
    mqc_decode(mqc);
    mqc_decode(mqc);
    mqc_decode(mqc);
    return;
  }
  return;
}

Assistant:

static void t1_dec_clnpass(
		opj_t1_t *t1,
		int bpno,
		int orient,
		int cblksty)
{
	int i, j, k, one, half, oneplushalf, agg, runlen, vsc;
	int segsym = cblksty & J2K_CCP_CBLKSTY_SEGSYM;
	
	opj_mqc_t *mqc = t1->mqc;	/* MQC component */
	
	one = 1 << bpno;
	half = one >> 1;
	oneplushalf = one | half;
	if (cblksty & J2K_CCP_CBLKSTY_VSC) {
	for (k = 0; k < t1->h; k += 4) {
		for (i = 0; i < t1->w; ++i) {
			if (k + 3 < t1->h) {
					agg = !(MACRO_t1_flags(1 + k,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| MACRO_t1_flags(1 + k + 1,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| MACRO_t1_flags(1 + k + 2,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
						|| (MACRO_t1_flags(1 + k + 3,1 + i) 
						& (~(T1_SIG_S | T1_SIG_SE | T1_SIG_SW |	T1_SGN_S))) & (T1_SIG | T1_VISIT | T1_SIG_OTH));
				} else {
				agg = 0;
			}
			if (agg) {
				mqc_setcurctx(mqc, T1_CTXNO_AGG);
				if (!mqc_decode(mqc)) {
					continue;
				}
				mqc_setcurctx(mqc, T1_CTXNO_UNI);
				runlen = mqc_decode(mqc);
				runlen = (runlen << 1) | mqc_decode(mqc);
			} else {
				runlen = 0;
			}
			for (j = k + runlen; j < k + 4 && j < t1->h; ++j) {
					vsc = (j == k + 3 || j == t1->h - 1) ? 1 : 0;
					t1_dec_clnpass_step_vsc(
						t1,
						&t1->flags[((j+1) * t1->flags_stride) + i + 1],
						&t1->data[(j * t1->w) + i],
						orient,
						oneplushalf,
						agg && (j == k + runlen),
						vsc);
			}
		}
	}
	} else {
		int *data1 = t1->data;
		flag_t *flags1 = &t1->flags[1];
		for (k = 0; k < (t1->h & ~3); k += 4) {
			for (i = 0; i < t1->w; ++i) {
				int *data2 = data1 + i;
				flag_t *flags2 = flags1 + i;
				agg = !(MACRO_t1_flags(1 + k,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
					|| MACRO_t1_flags(1 + k + 1,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
					|| MACRO_t1_flags(1 + k + 2,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH)
					|| MACRO_t1_flags(1 + k + 3,1 + i) & (T1_SIG | T1_VISIT | T1_SIG_OTH));
				if (agg) {
					mqc_setcurctx(mqc, T1_CTXNO_AGG);
					if (!mqc_decode(mqc)) {
						continue;
					}
					mqc_setcurctx(mqc, T1_CTXNO_UNI);
					runlen = mqc_decode(mqc);
					runlen = (runlen << 1) | mqc_decode(mqc);
					flags2 += runlen * t1->flags_stride;
					data2 += runlen * t1->w;
					for (j = k + runlen; j < k + 4 && j < t1->h; ++j) {
						flags2 += t1->flags_stride;
						if (agg && (j == k + runlen)) {
							t1_dec_clnpass_step_partial(t1, flags2, data2, orient, oneplushalf);
						} else {
							t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
						}
						data2 += t1->w;
					}
				} else {
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
					flags2 += t1->flags_stride;
					t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
					data2 += t1->w;
				}
			}
			data1 += t1->w << 2;
			flags1 += t1->flags_stride << 2;
		}
		for (i = 0; i < t1->w; ++i) {
			int *data2 = data1 + i;
			flag_t *flags2 = flags1 + i;
			for (j = k; j < t1->h; ++j) {
				flags2 += t1->flags_stride;
				t1_dec_clnpass_step(t1, flags2, data2, orient, oneplushalf);
				data2 += t1->w;
			}
		}
	}

	if (segsym) {
		int v = 0;
		mqc_setcurctx(mqc, T1_CTXNO_UNI);
		v = mqc_decode(mqc);
		v = (v << 1) | mqc_decode(mqc);
		v = (v << 1) | mqc_decode(mqc);
		v = (v << 1) | mqc_decode(mqc);
		/*
		if (v!=0xa) {
			opj_event_msg(t1->cinfo, EVT_WARNING, "Bad segmentation symbol %x\n", v);
		} 
		*/
	}
}